

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WritePPMPAM(FILE *fout,WebPDecBuffer *buffer,int alpha)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int in_EDX;
  long in_RSI;
  FILE *in_RDI;
  uint32_t y;
  size_t bytes_per_px;
  int stride;
  uint8_t *row;
  uint32_t height;
  uint32_t width;
  uint local_44;
  void *local_30;
  int local_4;
  
  if ((in_RDI == (FILE *)0x0) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    uVar1 = *(uint *)(in_RSI + 4);
    uVar2 = *(uint *)(in_RSI + 8);
    local_30 = *(void **)(in_RSI + 0x10);
    iVar3 = *(int *)(in_RSI + 0x18);
    iVar4 = 3;
    if (in_EDX != 0) {
      iVar4 = 4;
    }
    if (local_30 == (void *)0x0) {
      local_4 = 0;
    }
    else {
      if (in_EDX == 0) {
        fprintf(in_RDI,"P6\n%u %u\n255\n",(ulong)uVar1,(ulong)uVar2);
      }
      else {
        fprintf(in_RDI,"P7\nWIDTH %u\nHEIGHT %u\nDEPTH 4\nMAXVAL 255\nTUPLTYPE RGB_ALPHA\nENDHDR\n",
                (ulong)uVar1,(ulong)uVar2);
      }
      for (local_44 = 0; local_44 < uVar2; local_44 = local_44 + 1) {
        sVar5 = fwrite(local_30,(ulong)uVar1,(long)iVar4,in_RDI);
        if (sVar5 != (long)iVar4) {
          return 0;
        }
        local_30 = (void *)((long)local_30 + (long)iVar3);
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int WritePPMPAM(FILE* fout, const WebPDecBuffer* const buffer,
                       int alpha) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const uint32_t width = buffer->width;
    const uint32_t height = buffer->height;
    const uint8_t* row = buffer->u.RGBA.rgba;
    const int stride = buffer->u.RGBA.stride;
    const size_t bytes_per_px = alpha ? 4 : 3;
    uint32_t y;

    if (row == NULL) return 0;

    if (alpha) {
      fprintf(fout, "P7\nWIDTH %u\nHEIGHT %u\nDEPTH 4\nMAXVAL 255\n"
                    "TUPLTYPE RGB_ALPHA\nENDHDR\n", width, height);
    } else {
      fprintf(fout, "P6\n%u %u\n255\n", width, height);
    }
    for (y = 0; y < height; ++y) {
      if (fwrite(row, width, bytes_per_px, fout) != bytes_per_px) {
        return 0;
      }
      row += stride;
    }
  }
  return 1;
}